

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::~MeshEdgebreakerTraversalValenceEncoder
          (MeshEdgebreakerTraversalValenceEncoder *this)

{
  pointer piVar1;
  pointer pIVar2;
  RAnsBitEncoder *__ptr;
  pointer pEVar3;
  BitEncoder *pBVar4;
  pointer pcVar5;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->context_symbols_);
  piVar1 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->vertex_valences_).vector_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pIVar2 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar2 != (pointer)0x0) {
    operator_delete(pIVar2,(long)(this->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar2);
  }
  __ptr = (this->super_MeshEdgebreakerTraversalEncoder).attribute_connectivity_encoders_._M_t.
          super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>
          .super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl;
  if (__ptr != (RAnsBitEncoder *)0x0) {
    std::default_delete<draco::RAnsBitEncoder[]>::operator()
              ((default_delete<draco::RAnsBitEncoder[]> *)
               &(this->super_MeshEdgebreakerTraversalEncoder).attribute_connectivity_encoders_,__ptr
              );
  }
  (this->super_MeshEdgebreakerTraversalEncoder).attribute_connectivity_encoders_._M_t.
  super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>._M_t.
  super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>.
  super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl = (RAnsBitEncoder *)0x0;
  pEVar3 = (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
           super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar3 != (pointer)0x0) {
    operator_delete(pEVar3,(long)(this->super_MeshEdgebreakerTraversalEncoder).symbols_.
                                 super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar3);
  }
  pBVar4 = (this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.bit_encoder_._M_t.
           super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
           .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl;
  if (pBVar4 != (BitEncoder *)0x0) {
    operator_delete(pBVar4,0x10);
  }
  (this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.bit_encoder_._M_t.
  super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl = (BitEncoder *)0x0
  ;
  pcVar5 = (this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.buffer_.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  if (pcVar5 != (pointer)0x0) {
    operator_delete(pcVar5,(long)(this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.
                                 buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar5);
  }
  RAnsBitEncoder::~RAnsBitEncoder((RAnsBitEncoder *)this);
  return;
}

Assistant:

MeshEdgebreakerTraversalValenceEncoder()
      : corner_table_(nullptr),
        prev_symbol_(-1),
        last_corner_(kInvalidCornerIndex),
        num_symbols_(0),
        min_valence_(2),
        max_valence_(7) {}